

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  Field fieldSchema;
  Reader fieldValue;
  ElementCount index;
  StringPtr name;
  Reader field;
  Schema local_1c0;
  StructReader local_1b8;
  PointerReader local_188;
  CapTableReader *local_168;
  WirePointer *pWStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  PointerReader local_120;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  StructReader local_d8;
  ListReader local_a8;
  CapTableReader *local_70;
  WirePointer *pWStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1c0 = type.super_Schema.raw;
  if ((input._reader.dataSize < 0x10) || (*input._reader.data != 5)) {
    decodeObject();
  }
  else {
    if (input._reader.pointerCount == 0) {
      input._reader.nestingLimit = 0x7fffffff;
      input._reader.capTable = (CapTableReader *)0x0;
      input._reader.pointers = (WirePointer *)0x0;
      input._reader.segment = (SegmentReader *)0x0;
    }
    index = 0;
    local_120.segment = input._reader.segment;
    local_120.capTable = input._reader.capTable;
    local_120.pointer = input._reader.pointers;
    local_120.nestingLimit = input._reader.nestingLimit;
    capnp::_::PointerReader::getList(&local_a8,&local_120,INLINE_COMPOSITE,(word *)0x0);
    if (local_a8.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_1b8,&local_a8,index);
        local_188.capTable = local_1b8.capTable;
        local_188.pointer = local_1b8.pointers;
        local_188.segment = local_1b8.segment;
        local_188.nestingLimit = local_1b8.nestingLimit;
        if (local_1b8.pointerCount == 0) {
          local_188.capTable = (CapTableReader *)0x0;
          local_188.pointer = (WirePointer *)0x0;
          local_188.segment = (SegmentReader *)0x0;
          local_188.nestingLimit = 0x7fffffff;
        }
        name.content = (ArrayPtr<const_char>)
                       capnp::_::PointerReader::getBlob<capnp::Text>(&local_188,(void *)0x0,0);
        StructSchema::findFieldByName
                  ((Maybe<capnp::StructSchema::Field> *)&local_120,(StructSchema *)&local_1c0,name);
        if ((char)local_120.segment == '\x01') {
          local_158 = CONCAT44(local_120._28_4_,local_120.nestingLimit);
          local_40 = local_e8;
          uStack_38 = uStack_e0;
          local_50 = local_f8;
          uStack_48 = uStack_f0;
          uStack_58 = uStack_100;
          local_70 = local_120.capTable;
          pWStack_68 = local_120.pointer;
          local_168 = local_120.capTable;
          pWStack_160 = local_120.pointer;
          uStack_150 = uStack_100;
          local_148 = local_f8;
          uStack_140 = uStack_f0;
          local_138 = local_e8;
          uStack_130 = uStack_e0;
          if (local_1b8.pointerCount < 2) {
            local_120.nestingLimit = 0x7fffffff;
            local_120.capTable = (CapTableReader *)0x0;
            local_120.pointer = (WirePointer *)0x0;
            local_120.segment = (SegmentReader *)0x0;
          }
          else {
            local_120.pointer = local_1b8.pointers + 1;
            local_120.capTable = local_1b8.capTable;
            local_120.segment = local_1b8.segment;
            local_120.nestingLimit = local_1b8.nestingLimit;
          }
          local_60 = local_158;
          capnp::_::PointerReader::getStruct(&local_d8,&local_120,(word *)0x0);
          fieldSchema._8_8_ = pWStack_160;
          fieldSchema.parent.super_Schema.raw = (Schema)(Schema)local_168;
          fieldSchema.proto._reader.segment = (SegmentReader *)local_158;
          fieldSchema.proto._reader.capTable = (CapTableReader *)uStack_150;
          fieldSchema.proto._reader.data = (void *)local_148;
          fieldSchema.proto._reader.pointers = (WirePointer *)uStack_140;
          fieldSchema.proto._reader.dataSize = (undefined4)local_138;
          fieldSchema.proto._reader.pointerCount = local_138._4_2_;
          fieldSchema.proto._reader._38_2_ = local_138._6_2_;
          fieldSchema.proto._reader._40_8_ = uStack_130;
          fieldValue._reader.capTable = local_d8.capTable;
          fieldValue._reader.segment = local_d8.segment;
          fieldValue._reader.data = local_d8.data;
          fieldValue._reader.pointers = local_d8.pointers;
          fieldValue._reader.dataSize = local_d8.dataSize;
          fieldValue._reader.pointerCount = local_d8.pointerCount;
          fieldValue._reader._38_2_ = local_d8._38_2_;
          fieldValue._reader.nestingLimit = local_d8.nestingLimit;
          fieldValue._reader._44_4_ = local_d8._44_4_;
          decodeField(this,fieldSchema,fieldValue,orphanage,output);
        }
        index = index + 1;
      } while (local_a8.elementCount != index);
    }
  }
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_MAYBE(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(*fieldSchema, field.getValue(), orphanage, output);
    } else {
      // Unknown json fields are ignored to allow schema evolution
    }
  }
}